

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac.c
# Opt level: O0

int omac_imit_copy(EVP_MD_CTX *to,EVP_MD_CTX *from)

{
  long *plVar1;
  long *plVar2;
  CMAC_CTX *pCVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  OMAC_CTX *c_from;
  OMAC_CTX *c_to;
  int local_4;
  
  plVar1 = (long *)EVP_MD_CTX_get0_md_data(in_RDI);
  plVar2 = (long *)EVP_MD_CTX_get0_md_data(in_RSI);
  if ((plVar2 == (long *)0x0) || (plVar1 == (long *)0x0)) {
    local_4 = 0;
  }
  else {
    plVar1[1] = plVar2[1];
    plVar1[2] = plVar2[2];
    *(int *)(plVar1 + 3) = (int)plVar2[3];
    *(undefined8 *)((long)plVar1 + 0x1c) = *(undefined8 *)((long)plVar2 + 0x1c);
    *(undefined8 *)((long)plVar1 + 0x24) = *(undefined8 *)((long)plVar2 + 0x24);
    *(undefined8 *)((long)plVar1 + 0x2c) = *(undefined8 *)((long)plVar2 + 0x2c);
    *(undefined8 *)((long)plVar1 + 0x34) = *(undefined8 *)((long)plVar2 + 0x34);
    if (*plVar2 == 0) {
      if (*plVar1 != 0) {
        CMAC_CTX_free((CMAC_CTX *)*plVar1);
        *plVar1 = 0;
      }
      local_4 = 1;
    }
    else {
      if (*plVar1 == *plVar2) {
        pCVar3 = CMAC_CTX_new();
        *plVar1 = (long)pCVar3;
      }
      local_4 = CMAC_CTX_copy((CMAC_CTX *)*plVar1,(CMAC_CTX *)*plVar2);
    }
  }
  return local_4;
}

Assistant:

static int omac_imit_copy(EVP_MD_CTX *to, const EVP_MD_CTX *from)
{
    OMAC_CTX *c_to = EVP_MD_CTX_md_data(to);
    const OMAC_CTX *c_from = EVP_MD_CTX_md_data(from);

    if (c_from && c_to) {
        c_to->dgst_size = c_from->dgst_size;
        c_to->cipher_name = c_from->cipher_name;
        c_to->key_set = c_from->key_set;
        memcpy(c_to->key, c_from->key, 32);
    } else {
        return 0;
    }
    if (!c_from->cmac_ctx) {
        if (c_to->cmac_ctx) {
            CMAC_CTX_free(c_to->cmac_ctx);
            c_to->cmac_ctx = NULL;
        }
        return 1;
    }
    if (c_to->cmac_ctx == c_from->cmac_ctx) {
        c_to->cmac_ctx = CMAC_CTX_new();
    }
    return CMAC_CTX_copy(c_to->cmac_ctx, c_from->cmac_ctx);
}